

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

int findrec(int *a,int *b,int *c)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = (double)*a;
  dVar4 = (double)*b;
  dVar1 = (double)*c;
  if (dVar5 + dVar4 + dVar1 <= 192.0) {
    dVar3 = 1.0;
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    dVar3 = 1.0;
    do {
      iVar2 = iVar2 + 1;
      dVar3 = dVar3 + dVar3;
      dVar5 = ceil(dVar5 * 0.5);
      dVar4 = ceil(dVar4 * 0.5);
      dVar1 = ceil(dVar1 * 0.5);
    } while (192.0 < dVar5 + dVar4 + dVar1);
  }
  *a = (int)((double)(int)dVar5 * dVar3);
  *b = (int)((double)(int)dVar4 * dVar3);
  *c = (int)((double)(int)dVar1 * dVar3);
  return iVar2;
}

Assistant:

int findrec(int *a, int *b, int *c) {
	int rec;
	double da,db,dc,mul;
	da = (double) *a;
	db = (double) *b;
	dc = (double) *c;
	rec = 0;
	mul = 1.;
	
	while (da + db + dc > (double) CUTOFF) {
		rec++;
		mul *= 2;
		da = ceil(da/2.);
		db = ceil(db/2.);
		dc = ceil(dc/2.);
	}
	*a = (int) da * mul;
	*b = (int) db * mul;
	*c = (int) dc * mul;
	
	return rec;
}